

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::checkMsgType(DataDictionary *this,MsgType *msgType)

{
  bool bVar1;
  string *msgType_00;
  InvalidMessageType *this_00;
  allocator<char> local_39;
  string local_38;
  MsgType *local_18;
  MsgType *msgType_local;
  DataDictionary *this_local;
  
  local_18 = msgType;
  msgType_local = (MsgType *)this;
  msgType_00 = StringField::getValue_abi_cxx11_(&msgType->super_StringField);
  bVar1 = isMsgType(this,msgType_00);
  if (!bVar1) {
    this_00 = (InvalidMessageType *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    InvalidMessageType::InvalidMessageType(this_00,&local_38);
    __cxa_throw(this_00,&InvalidMessageType::typeinfo,InvalidMessageType::~InvalidMessageType);
  }
  return;
}

Assistant:

void checkMsgType(const MsgType &msgType) const {
    if (!isMsgType(msgType.getValue())) {
      throw InvalidMessageType();
    }
  }